

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilSupp.c
# Opt level: O0

void Abc_SuppVerify(Vec_Wrd_t *p,word *pMatrix,int nVars,int nVarsMin)

{
  bool bVar1;
  int iVar2;
  Vec_Wrd_t *p_00;
  word wVar3;
  word *pwVar4;
  uint local_64;
  int Counter;
  int Value;
  int v;
  int k;
  int i;
  word EntryNew;
  word Entry;
  word *pEntry2;
  word *pEntry1;
  word *pLimit;
  Vec_Wrd_t *pNew;
  int nVarsMin_local;
  int nVars_local;
  word *pMatrix_local;
  Vec_Wrd_t *p_local;
  
  local_64 = 0;
  iVar2 = Vec_WrdSize(p);
  p_00 = Vec_WrdAlloc(iVar2);
  for (v = 0; iVar2 = Vec_WrdSize(p), v < iVar2; v = v + 1) {
    wVar3 = Vec_WrdEntry(p,v);
    _k = 0;
    for (Counter = 0; Counter < nVarsMin; Counter = Counter + 1) {
      bVar1 = false;
      for (Value = 0; Value < nVars; Value = Value + 1) {
        if (((pMatrix[Counter] >> ((byte)Value & 0x3f) & 1) != 0) &&
           ((wVar3 >> ((byte)Value & 0x3f) & 1) != 0)) {
          bVar1 = (bool)(bVar1 ^ 1);
        }
      }
      if (bVar1) {
        _k = 1L << ((byte)Counter & 0x3f) | _k;
      }
    }
    Vec_WrdPush(p_00,_k);
  }
  pwVar4 = Vec_WrdLimit(p_00);
  for (pEntry2 = Vec_WrdArray(p_00); Entry = (word)pEntry2, pEntry2 < pwVar4; pEntry2 = pEntry2 + 1)
  {
    while (Entry = Entry + 8, Entry < pwVar4) {
      if (*pEntry2 == *(word *)Entry) {
        local_64 = local_64 + 1;
      }
    }
  }
  if (local_64 == 0) {
    printf("Verification successful.\n");
  }
  else {
    printf("The total of %d pairs fail verification.\n",(ulong)local_64);
  }
  Vec_WrdFree(p_00);
  return;
}

Assistant:

void Abc_SuppVerify( Vec_Wrd_t * p, word * pMatrix, int nVars, int nVarsMin )
{
    Vec_Wrd_t * pNew;
    word * pLimit, * pEntry1, * pEntry2;
    word Entry, EntryNew;
    int i, k, v, Value, Counter = 0;
    pNew = Vec_WrdAlloc( Vec_WrdSize(p) );
    Vec_WrdForEachEntry( p, Entry, i )
    {
        EntryNew = 0;
        for ( v = 0; v < nVarsMin; v++ )
        {
            Value = 0;
            for ( k = 0; k < nVars; k++ )
                if ( ((pMatrix[v] >> k) & 1) && ((Entry >> k) & 1) )
                    Value ^= 1;
            if ( Value )
                EntryNew |= (((word)1) << v);            
        }
        Vec_WrdPush( pNew, EntryNew );
    }
    // check that they are disjoint
    pLimit  = Vec_WrdLimit(pNew);
    pEntry1 = Vec_WrdArray(pNew);
    for ( ; pEntry1 < pLimit; pEntry1++ )
    for ( pEntry2 = pEntry1 + 1; pEntry2 < pLimit; pEntry2++ )
        if ( *pEntry1 == *pEntry2 )
            Counter++;
    if ( Counter )
        printf( "The total of %d pairs fail verification.\n", Counter );
    else
        printf( "Verification successful.\n" );
    Vec_WrdFree( pNew );
}